

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O2

shared_ptr<gui::MenuBarStyle> __thiscall gui::DefaultTheme::makeMenuBarStyle(DefaultTheme *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::MenuBarStyle> sVar1;
  Vector3f local_20;
  
  std::make_shared<gui::MenuBarStyle,gui::Gui_const&>((Gui *)this);
  MenuBarStyle::setBarFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightGray);
  MenuBarStyle::setMenuFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  MenuBarStyle::setMenuOutlineColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray2);
  MenuBarStyle::setMenuOutlineThickness((MenuBarStyle *)(this->super_Theme)._vptr_Theme,-1.0);
  MenuBarStyle::setFont((MenuBarStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48));
  MenuBarStyle::setCharacterSize((MenuBarStyle *)(this->super_Theme)._vptr_Theme,0xf);
  MenuBarStyle::setTextFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  local_20.z = *(float *)(in_RSI + 0x50);
  local_20.x = 10.0;
  local_20.y = 3.0;
  MenuBarStyle::setBarTextPadding((MenuBarStyle *)(this->super_Theme)._vptr_Theme,&local_20);
  local_20.z = *(float *)(in_RSI + 0x50);
  local_20.x = 18.0;
  local_20.y = 3.0;
  MenuBarStyle::setMenuTextPadding((MenuBarStyle *)(this->super_Theme)._vptr_Theme,&local_20);
  MenuBarStyle::setMinLeftRightTextWidth((MenuBarStyle *)(this->super_Theme)._vptr_Theme,40.0);
  MenuBarStyle::setDisabledTextFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorGray3);
  MenuBarStyle::setHighlightFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightBlue);
  MenuBarStyle::setDisabledHighlightFillColor
            ((MenuBarStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightGray2);
  sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::MenuBarStyle>)
         sVar1.super___shared_ptr<gui::MenuBarStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MenuBarStyle> DefaultTheme::makeMenuBarStyle() const {
    auto style = std::make_shared<MenuBarStyle>(gui_);
    style->setBarFillColor(colorLightGray);

    style->setMenuFillColor(sf::Color::White);
    style->setMenuOutlineColor(colorGray2);
    style->setMenuOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setBarTextPadding({10.0f, 3.0f, fontMaxHeightRatio_});
    style->setMenuTextPadding({18.0f, 3.0f, fontMaxHeightRatio_});
    style->setMinLeftRightTextWidth(40.0f);
    style->setDisabledTextFillColor(colorGray3);
    style->setHighlightFillColor(colorLightBlue);
    style->setDisabledHighlightFillColor(colorLightGray2);

    return style;
}